

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::ExtensionGenerator::Generate
          (ExtensionGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,"\n");
  PrintFieldComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "public static final com.google.protobuf.nano.Extension<\n    $extends$,\n    $class$> $name$ =\n        com.google.protobuf.nano.Extension.create$repeated$$ext_type$(\n            com.google.protobuf.nano.Extension.$type$,\n            $class$.class,\n            $tag_params$L);\n"
                    );
  return;
}

Assistant:

void ExtensionGenerator::Generate(io::Printer* printer) const {
  printer->Print("\n");
  PrintFieldComment(printer, descriptor_);
  printer->Print(variables_,
    "public static final com.google.protobuf.nano.Extension<\n"
    "    $extends$,\n"
    "    $class$> $name$ =\n"
    "        com.google.protobuf.nano.Extension.create$repeated$$ext_type$(\n"
    "            com.google.protobuf.nano.Extension.$type$,\n"
    "            $class$.class,\n"
    "            $tag_params$L);\n");
}